

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Dch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  Dch_Pars_t Pars;
  
  Dch_ManSetDefaultParams(&Pars);
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar1 = false;
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"WCSsptfremvh");
    iVar6 = globalUtilOptind;
    switch(iVar3) {
    case 0x65:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x66:
      Pars.fLightSynth = Pars.fLightSynth ^ 1;
      break;
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x75:
      goto switchD_00256fd2_caseD_67;
    case 0x6d:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x70:
      Pars.fPower = Pars.fPower ^ 1;
      break;
    case 0x72:
      Pars.fSkipRedSupp = Pars.fSkipRedSupp ^ 1;
      break;
    case 0x73:
      Pars.fSynthesis = Pars.fSynthesis ^ 1;
      break;
    case 0x74:
      Pars.fSimulateTfo = Pars.fSimulateTfo ^ 1;
      break;
    case 0x76:
      Pars.fVerbose = Pars.fVerbose ^ 1;
      break;
    default:
      if (iVar3 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_002570c2:
          Abc_Print(-1,pcVar5);
          goto switchD_00256fd2_caseD_67;
        }
        iVar3 = atoi(argv[globalUtilOptind]);
        Pars.nBTLimit = iVar3;
      }
      else if (iVar3 == 0x53) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_002570c2;
        }
        iVar3 = atoi(argv[globalUtilOptind]);
        Pars.nSatVarMax = iVar3;
      }
      else {
        if (iVar3 != 0x57) {
          if (iVar3 == -1) {
            pGVar4 = pAbc->pGia;
            if (pGVar4 == (Gia_Man_t *)0x0) {
              pcVar5 = "Abc_CommandAbc9Dch(): There is no AIG.\n";
            }
            else {
              if (pGVar4->nBufs == 0) {
                if (bVar1) {
                  pAig = Gia_ManToAigSimple(pGVar4);
                  if (pAbc->pGia->nObjs != pAig->vObjs->nSize - pAig->nDeleted) {
                    __assert_fail("Gia_ManObjNum(pAbc->pGia) == Aig_ManObjNum(pNew)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                                  ,0xa025,"int Abc_CommandAbc9Dch(Abc_Frame_t *, int, char **)");
                  }
                  Dch_ComputeEquivalences(pAig,&Pars);
                  Gia_ManReprFromAigRepr(pAig,pAbc->pGia);
                  Aig_ManStop(pAig);
                  pGVar4 = Gia_ManEquivReduce(pAbc->pGia,1,0,0,0);
                }
                else {
                  pGVar4 = Gia_ManPerformDch(pGVar4,&Pars);
                  Abc_FrameUpdateGia(pAbc,pGVar4);
                  if (bVar2) {
                    pGVar4 = Gia_ManEquivReduce2(pAbc->pGia);
                  }
                }
                Abc_FrameUpdateGia(pAbc,pGVar4);
                return 0;
              }
              pcVar5 = "Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n";
            }
            iVar6 = -1;
            goto LAB_00257222;
          }
          goto switchD_00256fd2_caseD_67;
        }
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_002570c2;
        }
        iVar3 = atoi(argv[globalUtilOptind]);
        Pars.nWords = iVar3;
      }
      globalUtilOptind = iVar6 + 1;
      if (iVar3 < 0) {
switchD_00256fd2_caseD_67:
        iVar6 = -2;
        Abc_Print(-2,"usage: &dch [-WCS num] [-sptfremvh]\n");
        Abc_Print(-2,"\t         computes structural choices using a new approach\n");
        Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                  (ulong)(uint)Pars.nWords);
        Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                  (ulong)(uint)Pars.nBTLimit);
        Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                  (ulong)(uint)Pars.nSatVarMax);
        pcVar7 = "yes";
        pcVar5 = "yes";
        if (Pars.fSynthesis == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-s     : toggle synthesizing three snapshots [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (Pars.fPower == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (Pars.fSimulateTfo == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (Pars.fLightSynth == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-f     : toggle using lighter logic synthesis [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (Pars.fSkipRedSupp == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-r     : toggle skipping choices with redundant support [default = %s]\n",
                  pcVar5);
        pcVar5 = "yes";
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-e     : toggle computing and merging equivalences [default = %s]\n",pcVar5)
        ;
        pcVar5 = "yes";
        if (!bVar2) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-m     : toggle minimizing logic level after merging equivalences [default = %s]\n"
                  ,pcVar5);
        if (Pars.fVerbose == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar7);
        pcVar5 = "\t-h     : print the command usage\n";
LAB_00257222:
        Abc_Print(iVar6,pcVar5);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Dch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManEquivReduce2( Gia_Man_t * p );
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c, fMinLevel = 0, fEquiv = 0;
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSsptfremvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSynthesis ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'r':
            pPars->fSkipRedSupp ^= 1;
            break;
        case 'e':
            fEquiv ^= 1;
            break;
        case 'm':
            fMinLevel ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( fEquiv )
    {
        Aig_Man_t * pNew = Gia_ManToAigSimple( pAbc->pGia );
        assert( Gia_ManObjNum(pAbc->pGia) == Aig_ManObjNum(pNew) );
        Dch_ComputeEquivalences( pNew, (Dch_Pars_t *)pPars );
        Gia_ManReprFromAigRepr( pNew, pAbc->pGia );
        Aig_ManStop( pNew );
        pTemp = Gia_ManEquivReduce( pAbc->pGia, 1, 0, 0, 0 );
    }
    else
    {
        pTemp = Gia_ManPerformDch( pAbc->pGia, pPars );
        Abc_FrameUpdateGia( pAbc, pTemp );
        if ( fMinLevel ) 
            pTemp = Gia_ManEquivReduce2( pAbc->pGia );
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &dch [-WCS num] [-sptfremvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-s     : toggle synthesizing three snapshots [default = %s]\n", pPars->fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle using lighter logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle skipping choices with redundant support [default = %s]\n", pPars->fSkipRedSupp? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle computing and merging equivalences [default = %s]\n", fEquiv? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle minimizing logic level after merging equivalences [default = %s]\n", fMinLevel? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}